

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O3

utf8proc_bool
duckdb::utf8proc_grapheme_break_stateful
          (utf8proc_int32_t c1,utf8proc_int32_t c2,utf8proc_int32_t *state)

{
  utf8proc_bool uVar1;
  undefined2 *puVar2;
  undefined2 *puVar3;
  
  puVar2 = &utf8proc_properties;
  puVar3 = &utf8proc_properties;
  if ((uint)c1 < 0x110000) {
    puVar3 = &utf8proc_properties +
             (ulong)*(ushort *)
                     (&utf8proc_stage2table +
                     (ulong)((c1 & 0xffU) + (uint)(ushort)(&utf8proc_stage1table)[(uint)c1 >> 8]) *
                     2) * 0xc;
  }
  if ((uint)c2 < 0x110000) {
    puVar2 = &utf8proc_properties +
             (ulong)*(ushort *)
                     (&utf8proc_stage2table +
                     (ulong)((c2 & 0xffU) + (uint)(ushort)(&utf8proc_stage1table)[(uint)c2 >> 8]) *
                     2) * 0xc;
  }
  uVar1 = grapheme_break_extended
                    ((ushort)puVar3[10] >> 8 & 0x3f,(ushort)puVar2[10] >> 8 & 0x3f,
                     (uint)((ushort)puVar3[10] >> 0xe),(uint)((ushort)puVar2[10] >> 0xe),state);
  return uVar1;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_bool utf8proc_grapheme_break_stateful(
    utf8proc_int32_t c1, utf8proc_int32_t c2, utf8proc_int32_t *state) {

  const utf8proc_property_t *p1 = utf8proc_get_property(c1);
  const utf8proc_property_t *p2 = utf8proc_get_property(c2);
  return grapheme_break_extended(p1->boundclass,
                                 p2->boundclass,
                                 p1->indic_conjunct_break,
                                 p2->indic_conjunct_break,
                                 state);
}